

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O2

void Abc_ShaManStop(Abc_ShaMan_t *p)

{
  Vec_Ptr_t *pVVar1;
  Vec_Int_t *__ptr;
  int i_1;
  long lVar2;
  int i;
  int i_00;
  
  for (i_00 = 0; pVVar1 = p->vBuckets, i_00 < pVVar1->nSize; i_00 = i_00 + 1) {
    pVVar1 = (Vec_Ptr_t *)Vec_PtrEntry(pVVar1,i_00);
    for (lVar2 = 0; lVar2 < pVVar1->nSize; lVar2 = lVar2 + 1) {
      if ((Vec_Ptr_t *)pVVar1->pArray[lVar2] != (Vec_Ptr_t *)0x0) {
        Vec_PtrFree((Vec_Ptr_t *)pVVar1->pArray[lVar2]);
      }
    }
    Vec_PtrFree(pVVar1);
  }
  if (pVVar1->pArray == (void **)0x0) {
LAB_002437c9:
    free(pVVar1);
    p->vBuckets = (Vec_Ptr_t *)0x0;
  }
  else {
    free(pVVar1->pArray);
    p->vBuckets->pArray = (void **)0x0;
    pVVar1 = p->vBuckets;
    if (pVVar1 != (Vec_Ptr_t *)0x0) goto LAB_002437c9;
  }
  __ptr = p->vObj2Lit;
  if (__ptr != (Vec_Int_t *)0x0) {
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
      p->vObj2Lit->pArray = (int *)0x0;
      __ptr = p->vObj2Lit;
      if (__ptr == (Vec_Int_t *)0x0) goto LAB_00243804;
    }
    free(__ptr);
  }
LAB_00243804:
  free(p);
  return;
}

Assistant:

void Abc_ShaManStop( Abc_ShaMan_t * p )
{
    Vec_Ptr_t * vBucket;
    int i;
    Vec_PtrForEachEntry( Vec_Ptr_t *, p->vBuckets, vBucket, i )
        Vec_VecFree( (Vec_Vec_t *)vBucket );
    Vec_PtrFreeP( &p->vBuckets );
    Vec_IntFreeP( &p->vObj2Lit );
    ABC_FREE( p );
}